

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

bech32_error
bech32_encode_using_original_constant(bech32_bstring *bstring,char *hrp,uchar *dp,size_t dplen)

{
  size_type sVar1;
  bech32_error bVar2;
  string b;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dpVec;
  string hrpStr;
  string local_38;
  
  if (dp == (uchar *)0x0 || (hrp == (char *)0x0 || bstring == (bech32_bstring *)0x0)) {
    bVar2 = E_BECH32_NULL_ARGUMENT;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&hrpStr,hrp,(allocator<char> *)&b);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dpVec,dp,dp + dplen,
               (allocator_type *)&b);
    b._M_dataplus._M_p = (pointer)&b.field_2;
    b._M_string_length = 0;
    b.field_2._M_local_buf[0] = '\0';
    bech32::encodeUsingOriginalConstant(&local_38,&hrpStr,&dpVec);
    std::__cxx11::string::operator=((string *)&b,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bstring->length < b._M_string_length) {
      bVar2 = E_BECH32_LENGTH_TOO_SHORT;
    }
    else {
      bVar2 = E_BECH32_SUCCESS;
      if (b._M_string_length == 0) {
        sVar1 = 0;
      }
      else {
        memmove(bstring->string,b._M_dataplus._M_p,b._M_string_length);
        sVar1 = b._M_string_length;
      }
      bstring->string[sVar1] = '\0';
    }
    std::__cxx11::string::~string((string *)&b);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&dpVec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::~string((string *)&hrpStr);
  }
  return bVar2;
}

Assistant:

bech32_error bech32_encode_using_original_constant(
        bech32_bstring *bstring,
        const char *hrp,
        const unsigned char *dp, size_t dplen) {

    if(bstring == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(hrp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dp == nullptr)
        return E_BECH32_NULL_ARGUMENT;

    std::string hrpStr(hrp);
    std::vector<unsigned char> dpVec(dp, dp + dplen);

    std::string b;
    try {
        b = bech32::encodeUsingOriginalConstant(hrpStr, dpVec);
    }
    catch (std::exception &) {
        // todo: convert exception message
        return E_BECH32_UNKNOWN_ERROR;
    }
    if(b.size() > bstring->length)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::copy_n(b.begin(), b.size(), bstring->string);
    bstring->string[b.size()] = '\0';

    return E_BECH32_SUCCESS;
}